

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O1

int mtrShiftHL(MtrNode *node,int shift)

{
  MtrNode *node_00;
  MtrHalfWord MVar1;
  int iVar2;
  
  iVar2 = 0;
  MVar1 = node->low + shift;
  if (-1 < (int)MVar1) {
    node->low = MVar1;
    if ((node->flags & 1) == 0) {
      for (node_00 = node->child; node_00 != (MtrNode *)0x0; node_00 = node_00->younger) {
        iVar2 = mtrShiftHL(node_00,shift);
        if (iVar2 == 0) {
          return 0;
        }
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
mtrShiftHL(
  MtrNode * node /* group tree node */,
  int  shift /* amount by which low should be changed */)
{
    MtrNode *auxnode;
    int low;

    low = (int) node->low;


    low += shift;

    if (low < 0 || low + (int) (node->size - 1) > (int) MTR_MAXHIGH) return(0);

    node->low = (MtrHalfWord) low;

    if (!MTR_TEST(node,MTR_TERMINAL) && node->child != NULL) {
        auxnode = node->child;
        do {
            if (!mtrShiftHL(auxnode,shift)) return(0);
            auxnode = auxnode->younger;
        } while (auxnode != NULL);
    }

    return(1);

}